

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O0

int obudec_read_temporal_unit
              (ObuDecInputContext *obu_ctx,uint8_t **buffer,size_t *bytes_read,size_t *buffer_size)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  size_t copy_size;
  size_t offset;
  size_t data_size;
  uint8_t *new_buffer;
  ObuHeader obu_header;
  uint64_t size;
  uint8_t tuheader [8];
  size_t length_of_temporal_unit_size;
  size_t obu_size;
  size_t tu_size;
  FILE *f;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  AvxInputContext *in_stack_ffffffffffffff60;
  size_t *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  AvxInputContext *in_stack_ffffffffffffff78;
  undefined1 local_78 [7];
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  size_t *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  ulong uVar6;
  uint8_t **in_stack_ffffffffffffffb0;
  AvxInputContext *pAVar7;
  AvxInputContext *local_38;
  long lVar8;
  int local_4;
  
  lVar8 = *(long *)(*in_RDI + 8);
  if (lVar8 == 0) {
    local_4 = -1;
  }
  else {
    *in_RCX = 0;
    *in_RDX = 0;
    _Var1 = input_eof((AvxInputContext *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    iVar2 = (int)lVar8;
    if (_Var1) {
      local_4 = 1;
    }
    else {
      pAVar7 = (AvxInputContext *)0x0;
      memset(&stack0xffffffffffffffb0,0,8);
      if ((int)in_RDI[4] == 0) {
        memset(local_78,0,0x20);
        in_stack_ffffffffffffff50 = 0;
        iVar2 = obudec_read_one_obu(pAVar7,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                                    in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                    (ObuHeader *)
                                    CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                                    iVar2,(_Bool)in_stack_ffffffffffffff8f);
        if (iVar2 != 0) {
          fprintf(_stderr,"obudec: read_one_obu failed in TU loop\n");
          return -1;
        }
        local_38 = (AvxInputContext *)in_RDI[3];
      }
      else {
        uVar6 = 0;
        if (in_RDI[3] == 0) {
          iVar2 = obudec_read_leb128(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                     in_stack_ffffffffffffff68,(uint64_t *)in_stack_ffffffffffffff60
                                     ,(_Bool)in_stack_ffffffffffffff5f);
          if (iVar2 != 0) {
            fprintf(_stderr,"obudec: Failure reading temporal unit header\n");
            return -1;
          }
          if ((uVar6 == 0) &&
             (_Var1 = input_eof((AvxInputContext *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)),
             _Var1)) {
            return 1;
          }
        }
        else {
          iVar2 = aom_uleb_decode((uint8_t *)in_RDI[1],in_RDI[3],
                                  (uint64_t *)&stack0xffffffffffffffa8,
                                  (size_t *)&stack0xffffffffffffffb8);
          if (iVar2 != 0) {
            fprintf(_stderr,"obudec: Failure reading temporal unit header\n");
            return -1;
          }
        }
        if ((0xffffffff < uVar6) || ((char *)0xffffffff < (pAVar7->detect).buf + (uVar6 - 0x18))) {
          fprintf(_stderr,"obudec: TU too large.\n");
          return -1;
        }
        local_38 = (AvxInputContext *)((pAVar7->detect).buf + (uVar6 - 0x18));
      }
      if (local_38 < (AvxInputContext *)0x200000001) {
        if (local_38 != (AvxInputContext *)0x0) {
          pvVar3 = realloc((void *)*in_RSI,(size_t)local_38);
          if (pvVar3 == (void *)0x0) {
            free((void *)*in_RSI);
            fprintf(_stderr,"obudec: Out of memory.\n");
            return -1;
          }
          *in_RSI = pvVar3;
        }
        *in_RDX = local_38;
        *in_RCX = local_38;
        if ((int)in_RDI[4] == 0) {
          memcpy((void *)*in_RSI,(void *)in_RDI[1],(size_t)local_38);
          memmove((void *)in_RDI[1],(void *)(in_RDI[1] + in_RDI[3]),0);
          in_RDI[3] = 0;
        }
        else {
          _Var1 = input_eof((AvxInputContext *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          if (!_Var1) {
            if (in_RDI[3] == 0) {
              sVar4 = (long)local_38 - (long)pAVar7;
              memcpy((void *)*in_RSI,&stack0xffffffffffffffb0,(size_t)pAVar7);
            }
            else {
              in_stack_ffffffffffffff60 = local_38;
              if ((AvxInputContext *)in_RDI[3] < local_38) {
                in_stack_ffffffffffffff60 = (AvxInputContext *)in_RDI[3];
              }
              pAVar7 = in_stack_ffffffffffffff60;
              memcpy((void *)*in_RSI,(void *)in_RDI[1],(size_t)in_stack_ffffffffffffff60);
              sVar4 = (long)local_38 - (long)pAVar7;
              in_RDI[3] = in_RDI[3] - (long)pAVar7;
            }
            sVar5 = read_from_input(in_stack_ffffffffffffff60,
                                    CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                                    (uchar *)CONCAT44(in_stack_ffffffffffffff54,
                                                      in_stack_ffffffffffffff50));
            if (sVar5 != sVar4) {
              fprintf(_stderr,"obudec: Failed to read full temporal unit\n");
              return -1;
            }
          }
        }
        local_4 = 0;
      }
      else {
        fprintf(_stderr,"obudec: Temporal Unit size exceeds max alloc size.\n");
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int obudec_read_temporal_unit(struct ObuDecInputContext *obu_ctx,
                              uint8_t **buffer, size_t *bytes_read,
                              size_t *buffer_size) {
  FILE *f = obu_ctx->avx_ctx->file;
  if (!f) return -1;

  *buffer_size = 0;
  *bytes_read = 0;

  if (input_eof(obu_ctx->avx_ctx)) {
    return 1;
  }

  size_t tu_size;
  size_t obu_size = 0;
  size_t length_of_temporal_unit_size = 0;
  uint8_t tuheader[OBU_MAX_LENGTH_FIELD_SIZE] = { 0 };

  if (obu_ctx->is_annexb) {
    uint64_t size = 0;

    if (obu_ctx->bytes_buffered == 0) {
      if (obudec_read_leb128(obu_ctx->avx_ctx, &tuheader[0],
                             &length_of_temporal_unit_size, &size,
                             /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
      if (size == 0 && input_eof(obu_ctx->avx_ctx)) {
        return 1;
      }
    } else {
      // temporal unit size was already stored in buffer
      if (aom_uleb_decode(obu_ctx->buffer, obu_ctx->bytes_buffered, &size,
                          &length_of_temporal_unit_size) != 0) {
        fprintf(stderr, "obudec: Failure reading temporal unit header\n");
        return -1;
      }
    }

    if (size > UINT32_MAX || size + length_of_temporal_unit_size > UINT32_MAX) {
      fprintf(stderr, "obudec: TU too large.\n");
      return -1;
    }

    size += length_of_temporal_unit_size;
    tu_size = (size_t)size;
  } else {
    while (1) {
      ObuHeader obu_header;
      memset(&obu_header, 0, sizeof(obu_header));

      if (obudec_read_one_obu(obu_ctx->avx_ctx, &obu_ctx->buffer,
                              obu_ctx->bytes_buffered,
                              &obu_ctx->buffer_capacity, &obu_size, &obu_header,
                              0, /*buffered=*/false) != 0) {
        fprintf(stderr, "obudec: read_one_obu failed in TU loop\n");
        return -1;
      }

      if (obu_header.type == OBU_TEMPORAL_DELIMITER || obu_size == 0) {
        tu_size = obu_ctx->bytes_buffered;
        break;
      } else {
        obu_ctx->bytes_buffered += obu_size;
      }
    }
  }

#if defined AOM_MAX_ALLOCABLE_MEMORY
  if (tu_size > AOM_MAX_ALLOCABLE_MEMORY) {
    fprintf(stderr, "obudec: Temporal Unit size exceeds max alloc size.\n");
    return -1;
  }
#endif
  if (tu_size > 0) {
    uint8_t *new_buffer = (uint8_t *)realloc(*buffer, tu_size);
    if (!new_buffer) {
      free(*buffer);
      fprintf(stderr, "obudec: Out of memory.\n");
      return -1;
    }
    *buffer = new_buffer;
  }
  *bytes_read = tu_size;
  *buffer_size = tu_size;

  if (!obu_ctx->is_annexb) {
    memcpy(*buffer, obu_ctx->buffer, tu_size);

    // At this point, (obu_ctx->buffer + obu_ctx->bytes_buffered + obu_size)
    // points to the end of the buffer.
    memmove(obu_ctx->buffer, obu_ctx->buffer + obu_ctx->bytes_buffered,
            obu_size);
    obu_ctx->bytes_buffered = obu_size;
  } else {
    if (!input_eof(obu_ctx->avx_ctx)) {
      size_t data_size;
      size_t offset;
      if (!obu_ctx->bytes_buffered) {
        data_size = tu_size - length_of_temporal_unit_size;
        memcpy(*buffer, &tuheader[0], length_of_temporal_unit_size);
        offset = length_of_temporal_unit_size;
      } else {
        const size_t copy_size = AOMMIN(obu_ctx->bytes_buffered, tu_size);
        memcpy(*buffer, obu_ctx->buffer, copy_size);
        offset = copy_size;
        data_size = tu_size - copy_size;
        obu_ctx->bytes_buffered -= copy_size;
      }

      if (read_from_input(obu_ctx->avx_ctx, data_size, *buffer + offset) !=
          data_size) {
        fprintf(stderr, "obudec: Failed to read full temporal unit\n");
        return -1;
      }
    }
  }
  return 0;
}